

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.cpp
# Opt level: O2

void Assimp::FBX::Util::DOMError(string *message,Token *token)

{
  DeadlyImportError *this;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"FBX-DOM",&local_61);
  AddTokenText(&local_40,&local_60,message,token);
  DeadlyImportError::DeadlyImportError(this,&local_40);
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DOMError(const std::string& message, const Token& token)
{
    throw DeadlyImportError(Util::AddTokenText("FBX-DOM",message,&token));
}